

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void Centaurus::LDFARoutineEM64T<unsigned_char>::emit
               (X86Assembler *as,Label *rejectlabel,LookaheadDFA<unsigned_char> *ldfa,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *exitlabels)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  LDFAState<unsigned_char> *state;
  Operand_ *in_stack_ffffffffffffff48;
  Operand_ *in_stack_ffffffffffffff50;
  X86Assembler *as_00;
  undefined8 in_stack_ffffffffffffff58;
  uint32_t instId;
  Label *rejectlabel_00;
  CodeEmitter *in_stack_ffffffffffffff60;
  int local_7c;
  undefined1 local_78 [4];
  int i_1;
  int local_68;
  int i;
  undefined1 local_58 [8];
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> statelabels;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> *exitlabels_local;
  LookaheadDFA<unsigned_char> *ldfa_local;
  Label *rejectlabel_local;
  X86Assembler *as_local;
  
  instId = (uint32_t)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)exitlabels;
  std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::vector
            ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_58);
  asmjit::CodeEmitter::emit
            (in_stack_ffffffffffffff60,instId,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_68 = 0;
  while( true ) {
    iVar2 = local_68;
    iVar1 = LookaheadDFA<unsigned_char>::get_state_num(ldfa);
    if (iVar1 <= iVar2) break;
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(local_78);
    std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::push_back
              ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_58,
               (value_type *)local_78);
    local_68 = local_68 + 1;
  }
  local_7c = 0;
  while( true ) {
    iVar2 = LookaheadDFA<unsigned_char>::get_state_num(ldfa);
    if (iVar2 <= local_7c) break;
    pvVar3 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                       ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_58,
                        (long)local_7c);
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,pvVar3);
    as_00 = as;
    rejectlabel_00 = rejectlabel;
    state = LookaheadDFA<unsigned_char>::operator[](ldfa,local_7c);
    emit_state(as_00,rejectlabel_00,state,
               (vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_58,
               (vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)
               statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage);
    local_7c = local_7c + 1;
  }
  std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::~vector
            ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_58);
  return;
}

Assistant:

void LDFARoutineEM64T<TCHAR>::emit(asmjit::X86Assembler& as, asmjit::Label& rejectlabel, const LookaheadDFA<TCHAR>& ldfa, std::vector<asmjit::Label>& exitlabels)
{
    std::vector<asmjit::Label> statelabels;

    as.mov(PEEK_REG, INPUT_REG);

    for (int i = 0; i < ldfa.get_state_num(); i++)
    {
        statelabels.push_back(as.newLabel());
    }
    for (int i = 0; i < ldfa.get_state_num(); i++)
    {
        as.bind(statelabels[i]);
        emit_state(as, rejectlabel, ldfa[i], statelabels, exitlabels);
    }
}